

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::NodeLoader15::begin__instance_node
          (NodeLoader15 *this,instance_node__AttributeData *attributeData)

{
  int iVar1;
  uint local_210 [2];
  URI local_208;
  URI local_120;
  ParserChar *local_38;
  ParserChar *pPStack_30;
  
  COLLADABU::URI::URI(&local_208);
  COLLADABU::URI::URI(&local_120);
  local_210[0] = 0;
  local_38 = attributeData->sid;
  pPStack_30 = attributeData->name;
  if ((attributeData->present_attributes & 2) != 0) {
    COLLADABU::URI::operator=(&local_120,&attributeData->url);
    local_210[0] = local_210[0] | 2;
  }
  if ((attributeData->present_attributes & 1) != 0) {
    COLLADABU::URI::operator=(&local_208,&attributeData->proxy);
    local_210[0] = local_210[0] | 1;
  }
  iVar1 = (*(this->mLoader->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x20])
                    (this->mLoader,local_210);
  COLLADABU::URI::~URI(&local_120);
  COLLADABU::URI::~URI(&local_208);
  return SUB41(iVar1,0);
}

Assistant:

bool NodeLoader15::begin__instance_node( const COLLADASaxFWL15::instance_node__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_node(attributeData));
COLLADASaxFWL::instance_node__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_node__AttributeData::ATTRIBUTE_URL_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT) == COLLADASaxFWL15::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT ) {
    attrData.proxy = attributeData.proxy;
    attrData.present_attributes |= COLLADASaxFWL::instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT;
}
return mLoader->begin__instance_node(attrData);
}